

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_enrich3(REF_GRID ref_grid)

{
  uint uVar1;
  REF_STATUS RVar2;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL t;
  REF_INT new_cell;
  REF_INT cell;
  REF_INT nodes [27];
  REF_GLOB local_50;
  REF_GLOB global;
  REF_INT node;
  REF_INT part;
  REF_INT *edge_node;
  REF_EDGE pRStack_30;
  REF_INT edge;
  REF_EDGE ref_edge;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->mpi;
  ref_edge = (REF_EDGE)ref_grid->node;
  ref_mpi = (REF_MPI)ref_grid;
  uVar1 = ref_geom_constrain_all(ref_grid);
  if (uVar1 == 0) {
    uVar1 = ref_edge_create(&stack0xffffffffffffffd0,(REF_GRID)ref_mpi);
    if (uVar1 == 0) {
      if (pRStack_30->n * 2 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x1007,"ref_geom_enrich3","malloc edge_node of REF_INT negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        _node = malloc((long)(pRStack_30->n << 1) << 2);
        if (_node == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x1007,"ref_geom_enrich3","malloc edge_node of REF_INT NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          for (ref_private_macro_code_rss_3 = 0;
              SBORROW4(ref_private_macro_code_rss_3,pRStack_30->n * 2) !=
              ref_private_macro_code_rss_3 + pRStack_30->n * -2 < 0;
              ref_private_macro_code_rss_3 = ref_private_macro_code_rss_3 + 1) {
            *(undefined4 *)((long)_node + (long)ref_private_macro_code_rss_3 * 4) = 0xffffffff;
          }
          for (edge_node._4_4_ = 0; edge_node._4_4_ < pRStack_30->n;
              edge_node._4_4_ = edge_node._4_4_ + 1) {
            uVar1 = ref_edge_part(pRStack_30,edge_node._4_4_,(REF_INT *)((long)&global + 4));
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x1009,"ref_geom_enrich3",(ulong)uVar1,"edge part");
              return uVar1;
            }
            if (ref_node->max == global._4_4_) {
              uVar1 = ref_node_next_global((REF_NODE)ref_edge,&local_50);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x100c,"ref_geom_enrich3",(ulong)uVar1,"next global");
                return uVar1;
              }
              uVar1 = ref_node_add((REF_NODE)ref_edge,local_50,(REF_INT *)&global);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x100d,"ref_geom_enrich3",(ulong)uVar1,"add node");
                return uVar1;
              }
              *(REF_INT *)((long)_node + (long)(edge_node._4_4_ << 1) * 4) = (REF_INT)global;
              uVar1 = ref_node_interpolate_edge
                                ((REF_NODE)ref_edge,pRStack_30->e2n[edge_node._4_4_ << 1],
                                 pRStack_30->e2n[edge_node._4_4_ * 2 + 1],0.3333333333333333,
                                 (REF_INT)global);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x1011,"ref_geom_enrich3",(ulong)uVar1,"new node");
                return uVar1;
              }
              uVar1 = ref_geom_add_constrain_midnode
                                ((REF_GRID)ref_mpi,pRStack_30->e2n[edge_node._4_4_ << 1],
                                 pRStack_30->e2n[edge_node._4_4_ * 2 + 1],0.3333333333333333,
                                 (REF_INT)global);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x1015,"ref_geom_enrich3",(ulong)uVar1,"new geom");
                return uVar1;
              }
              uVar1 = ref_node_next_global((REF_NODE)ref_edge,&local_50);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x1017,"ref_geom_enrich3",(ulong)uVar1,"next global");
                return uVar1;
              }
              uVar1 = ref_node_add((REF_NODE)ref_edge,local_50,(REF_INT *)&global);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x1018,"ref_geom_enrich3",(ulong)uVar1,"add node");
                return uVar1;
              }
              *(REF_INT *)((long)_node + (long)(edge_node._4_4_ * 2 + 1) * 4) = (REF_INT)global;
              uVar1 = ref_node_interpolate_edge
                                ((REF_NODE)ref_edge,pRStack_30->e2n[edge_node._4_4_ << 1],
                                 pRStack_30->e2n[edge_node._4_4_ * 2 + 1],0.6666666666666666,
                                 (REF_INT)global);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x101c,"ref_geom_enrich3",(ulong)uVar1,"new node");
                return uVar1;
              }
              uVar1 = ref_geom_add_constrain_midnode
                                ((REF_GRID)ref_mpi,pRStack_30->e2n[edge_node._4_4_ << 1],
                                 pRStack_30->e2n[edge_node._4_4_ * 2 + 1],0.6666666666666666,
                                 (REF_INT)global);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x1020,"ref_geom_enrich3",(ulong)uVar1,"new geom");
                return uVar1;
              }
            }
          }
          for (t._4_4_ = 0; t._4_4_ < *(int *)((long)ref_mpi->comm + 0x2c); t._4_4_ = t._4_4_ + 1) {
            RVar2 = ref_cell_nodes((REF_CELL)ref_mpi->comm,t._4_4_,&new_cell);
            if (RVar2 == 0) {
              (&new_cell)[*(int *)((long)ref_mpi->first_time + 0xc)] =
                   (&new_cell)[*(int *)((long)ref_mpi->comm + 0xc)];
              uVar1 = ref_edge_with(pRStack_30,new_cell,cell,(REF_INT *)((long)&edge_node + 4));
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x1028,"ref_geom_enrich3",(ulong)uVar1,"find edge01");
                return uVar1;
              }
              if (new_cell == pRStack_30->e2n[edge_node._4_4_ << 1]) {
                nodes[0] = *(REF_INT *)((long)_node + (long)(edge_node._4_4_ << 1) * 4);
                nodes[1] = *(REF_INT *)((long)_node + (long)(edge_node._4_4_ * 2 + 1) * 4);
              }
              else {
                nodes[0] = *(REF_INT *)((long)_node + (long)(edge_node._4_4_ * 2 + 1) * 4);
                nodes[1] = *(REF_INT *)((long)_node + (long)(edge_node._4_4_ << 1) * 4);
              }
              uVar1 = ref_cell_add((REF_CELL)ref_mpi->first_time,&new_cell,(REF_INT *)&t);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x1031,"ref_geom_enrich3",(ulong)uVar1,"add");
                return uVar1;
              }
            }
          }
          for (t._4_4_ = 0; t._4_4_ < *(int *)(*(long *)&ref_mpi->native_alltoallv + 0x2c);
              t._4_4_ = t._4_4_ + 1) {
            RVar2 = ref_cell_nodes(*(REF_CELL *)&ref_mpi->native_alltoallv,t._4_4_,&new_cell);
            if (RVar2 == 0) {
              uVar1 = ref_node_next_global((REF_NODE)ref_edge,&local_50);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x1035,"ref_geom_enrich3",(ulong)uVar1,"next global");
                return uVar1;
              }
              uVar1 = ref_node_add((REF_NODE)ref_edge,local_50,(REF_INT *)&global);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x1036,"ref_geom_enrich3",(ulong)uVar1,"add node");
                return uVar1;
              }
              uVar1 = ref_node_interpolate_face
                                ((REF_NODE)ref_edge,new_cell,cell,nodes[0],(REF_INT)global);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x1038,"ref_geom_enrich3",(ulong)uVar1,"new node");
                return uVar1;
              }
              uVar1 = ref_geom_add_constrain_inside_midnode
                                ((REF_GRID)ref_mpi,&new_cell,(REF_INT)global);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x103a,"ref_geom_enrich3",(ulong)uVar1,"new node");
                return uVar1;
              }
              nodes[7] = (REF_INT)global;
              (&new_cell)[*(int *)(*(long *)(ref_mpi + 1) + 0xc)] =
                   (&new_cell)[*(int *)(*(long *)&ref_mpi->native_alltoallv + 0xc)];
              uVar1 = ref_edge_with(pRStack_30,new_cell,cell,(REF_INT *)((long)&edge_node + 4));
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x1040,"ref_geom_enrich3",(ulong)uVar1,"find edge01");
                return uVar1;
              }
              if (new_cell == pRStack_30->e2n[edge_node._4_4_ << 1]) {
                nodes[1] = *(REF_INT *)((long)_node + (long)(edge_node._4_4_ << 1) * 4);
                nodes[2] = *(REF_INT *)((long)_node + (long)(edge_node._4_4_ * 2 + 1) * 4);
              }
              else {
                nodes[1] = *(REF_INT *)((long)_node + (long)(edge_node._4_4_ * 2 + 1) * 4);
                nodes[2] = *(REF_INT *)((long)_node + (long)(edge_node._4_4_ << 1) * 4);
              }
              uVar1 = ref_edge_with(pRStack_30,cell,nodes[0],(REF_INT *)((long)&edge_node + 4));
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x1048,"ref_geom_enrich3",(ulong)uVar1,"find edge12");
                return uVar1;
              }
              if (cell == pRStack_30->e2n[edge_node._4_4_ << 1]) {
                nodes[3] = *(REF_INT *)((long)_node + (long)(edge_node._4_4_ << 1) * 4);
                nodes[4] = *(REF_INT *)((long)_node + (long)(edge_node._4_4_ * 2 + 1) * 4);
              }
              else {
                nodes[3] = *(REF_INT *)((long)_node + (long)(edge_node._4_4_ * 2 + 1) * 4);
                nodes[4] = *(REF_INT *)((long)_node + (long)(edge_node._4_4_ << 1) * 4);
              }
              uVar1 = ref_edge_with(pRStack_30,nodes[0],new_cell,(REF_INT *)((long)&edge_node + 4));
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x1050,"ref_geom_enrich3",(ulong)uVar1,"find edge20");
                return uVar1;
              }
              if (nodes[0] == pRStack_30->e2n[edge_node._4_4_ << 1]) {
                nodes[5] = *(REF_INT *)((long)_node + (long)(edge_node._4_4_ << 1) * 4);
                nodes[6] = *(REF_INT *)((long)_node + (long)(edge_node._4_4_ * 2 + 1) * 4);
              }
              else {
                nodes[5] = *(REF_INT *)((long)_node + (long)(edge_node._4_4_ * 2 + 1) * 4);
                nodes[6] = *(REF_INT *)((long)_node + (long)(edge_node._4_4_ << 1) * 4);
              }
              uVar1 = ref_cell_add(*(REF_CELL *)(ref_mpi + 1),&new_cell,(REF_INT *)&t);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0x1059,"ref_geom_enrich3",(ulong)uVar1,"add");
                return uVar1;
              }
            }
          }
          if (_node != (void *)0x0) {
            free(_node);
          }
          uVar1 = ref_edge_free(pRStack_30);
          if (uVar1 == 0) {
            for (t._4_4_ = 0; t._4_4_ < *(int *)((long)ref_mpi->comm + 0x2c); t._4_4_ = t._4_4_ + 1)
            {
              if (((-1 < t._4_4_) && (t._4_4_ < *(int *)((long)ref_mpi->comm + 0x2c))) &&
                 (*(int *)(*(long *)((long)ref_mpi->comm + 0x38) +
                          (long)(*(int *)((long)ref_mpi->comm + 8) * t._4_4_) * 4) != -1)) {
                ref_cell_remove((REF_CELL)ref_mpi->comm,t._4_4_);
              }
            }
            for (t._4_4_ = 0; t._4_4_ < *(int *)(*(long *)&ref_mpi->native_alltoallv + 0x2c);
                t._4_4_ = t._4_4_ + 1) {
              if (((-1 < t._4_4_) &&
                  (t._4_4_ < *(int *)(*(long *)&ref_mpi->native_alltoallv + 0x2c))) &&
                 (*(int *)(*(long *)(*(long *)&ref_mpi->native_alltoallv + 0x38) +
                          (long)(*(int *)(*(long *)&ref_mpi->native_alltoallv + 8) * t._4_4_) * 4)
                  != -1)) {
                ref_cell_remove(*(REF_CELL *)&ref_mpi->native_alltoallv,t._4_4_);
              }
            }
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x105d,"ref_geom_enrich3",(ulong)uVar1,"free edge");
            ref_grid_local._4_4_ = uVar1;
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1006
             ,"ref_geom_enrich3",(ulong)uVar1,"edge");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1004,
           "ref_geom_enrich3",(ulong)uVar1,"constrain");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_enrich3(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge, *edge_node, part, node;
  REF_GLOB global;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell, new_cell;
  REF_DBL t;

  RSS(ref_geom_constrain_all(ref_grid), "constrain");

  RSS(ref_edge_create(&ref_edge, ref_grid), "edge");
  ref_malloc_init(edge_node, 2 * ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (ref_mpi_rank(ref_mpi) == part) {
      t = 1.0 / 3.0;
      RSS(ref_node_next_global(ref_node, &global), "next global");
      RSS(ref_node_add(ref_node, global, &node), "add node");
      edge_node[0 + 2 * edge] = node;
      RSS(ref_node_interpolate_edge(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                    ref_edge_e2n(ref_edge, 1, edge), t, node),
          "new node");
      RSS(ref_geom_add_constrain_midnode(
              ref_grid, ref_edge_e2n(ref_edge, 0, edge),
              ref_edge_e2n(ref_edge, 1, edge), t, node),
          "new geom");
      t = 2.0 / 3.0;
      RSS(ref_node_next_global(ref_node, &global), "next global");
      RSS(ref_node_add(ref_node, global, &node), "add node");
      edge_node[1 + 2 * edge] = node;
      RSS(ref_node_interpolate_edge(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                    ref_edge_e2n(ref_edge, 1, edge), t, node),
          "new node");
      RSS(ref_geom_add_constrain_midnode(
              ref_grid, ref_edge_e2n(ref_edge, 0, edge),
              ref_edge_e2n(ref_edge, 1, edge), t, node),
          "new geom");
    }
  }

  each_ref_cell_valid_cell_with_nodes(ref_grid_edg(ref_grid), cell, nodes) {
    nodes[ref_cell_id_index(ref_grid_ed3(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_edg(ref_grid))];

    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge01");
    if (nodes[0] == ref_edge_e2n(ref_edge, 0, edge)) {
      nodes[2] = edge_node[0 + 2 * edge]; /* forward edge, tri side direction */
      nodes[3] = edge_node[1 + 2 * edge];
    } else {
      nodes[2] = edge_node[1 + 2 * edge]; /* reverse edge, tri side direction */
      nodes[3] = edge_node[0 + 2 * edge];
    }

    RSS(ref_cell_add(ref_grid_ed3(ref_grid), nodes, &new_cell), "add");
  }

  each_ref_cell_valid_cell_with_nodes(ref_grid_tri(ref_grid), cell, nodes) {
    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &node), "add node");
    RSS(ref_node_interpolate_face(ref_node, nodes[0], nodes[1], nodes[2], node),
        "new node");
    RSS(ref_geom_add_constrain_inside_midnode(ref_grid, nodes, node),
        "new node");
    nodes[9] = node;

    nodes[ref_cell_id_index(ref_grid_tr3(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_tri(ref_grid))];

    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge01");
    if (nodes[0] == ref_edge_e2n(ref_edge, 0, edge)) {
      nodes[3] = edge_node[0 + 2 * edge]; /* forward edge, tri side direction */
      nodes[4] = edge_node[1 + 2 * edge];
    } else {
      nodes[3] = edge_node[1 + 2 * edge]; /* reverse edge, tri side direction */
      nodes[4] = edge_node[0 + 2 * edge];
    }
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge), "find edge12");
    if (nodes[1] == ref_edge_e2n(ref_edge, 0, edge)) {
      nodes[5] = edge_node[0 + 2 * edge]; /* forward edge, tri side direction */
      nodes[6] = edge_node[1 + 2 * edge];
    } else {
      nodes[5] = edge_node[1 + 2 * edge]; /* reverse edge, tri side direction */
      nodes[6] = edge_node[0 + 2 * edge];
    }
    RSS(ref_edge_with(ref_edge, nodes[2], nodes[0], &edge), "find edge20");
    if (nodes[2] == ref_edge_e2n(ref_edge, 0, edge)) {
      nodes[7] = edge_node[0 + 2 * edge]; /* forward edge, tri side direction */
      nodes[8] = edge_node[1 + 2 * edge];
    } else {
      nodes[7] = edge_node[1 + 2 * edge]; /* reverse edge, tri side direction */
      nodes[8] = edge_node[0 + 2 * edge];
    }

    RSS(ref_cell_add(ref_grid_tr3(ref_grid), nodes, &new_cell), "add");
  }

  ref_free(edge_node);
  RSS(ref_edge_free(ref_edge), "free edge");

  each_ref_cell_valid_cell(ref_grid_edg(ref_grid), cell) {
    ref_cell_remove(ref_grid_edg(ref_grid), cell);
  }
  each_ref_cell_valid_cell(ref_grid_tri(ref_grid), cell) {
    ref_cell_remove(ref_grid_tri(ref_grid), cell);
  }

  return REF_SUCCESS;
}